

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::deleteVertexArray(ReferenceContext *this,VertexArray *vertexArray)

{
  size_type sVar1;
  reference pvVar2;
  ulong local_20;
  size_t ndx;
  VertexArray *vertexArray_local;
  ReferenceContext *this_local;
  
  if (this->m_vertexArrayBinding == vertexArray) {
    (*(this->super_Context)._vptr_Context[0x4b])(this,0);
  }
  if (vertexArray->m_elementArrayBufferBinding != (DataBuffer *)0x0) {
    rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
              (&this->m_buffers,vertexArray->m_elementArrayBufferBinding);
  }
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
            ::size(&vertexArray->m_arrays);
    if (sVar1 <= local_20) break;
    pvVar2 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&vertexArray->m_arrays,local_20);
    if (pvVar2->bufferBinding != (DataBuffer *)0x0) {
      pvVar2 = std::
               vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
               ::operator[](&vertexArray->m_arrays,local_20);
      rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
                (&this->m_buffers,pvVar2->bufferBinding);
    }
    local_20 = local_20 + 1;
  }
  rc::ObjectManager<sglr::rc::VertexArray>::releaseReference(&this->m_vertexArrays,vertexArray);
  return;
}

Assistant:

void ReferenceContext::deleteVertexArray (rc::VertexArray* vertexArray)
{
	if (m_vertexArrayBinding == vertexArray)
		bindVertexArray(0);

	if (vertexArray->m_elementArrayBufferBinding)
		m_buffers.releaseReference(vertexArray->m_elementArrayBufferBinding);

	for (size_t ndx = 0; ndx < vertexArray->m_arrays.size(); ++ndx)
		if (vertexArray->m_arrays[ndx].bufferBinding)
			m_buffers.releaseReference(vertexArray->m_arrays[ndx].bufferBinding);

	DE_ASSERT(vertexArray->getRefCount() == 1);
	m_vertexArrays.releaseReference(vertexArray);
}